

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O3

string * __thiscall
leveldb::AutoCompactTest::Key_abi_cxx11_(string *__return_storage_ptr__,AutoCompactTest *this,int i)

{
  size_t sVar1;
  char buf [100];
  char acStack_78 [104];
  
  snprintf(acStack_78,100,"key%06d",i);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_78);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_78,acStack_78 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Key(int i) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "key%06d", i);
    return std::string(buf);
  }